

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O0

int os_routing_linux_set(os_route *route,_Bool set,_Bool del_similar)

{
  oonf_log_source oVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool local_6bf;
  undefined1 local_6be [8];
  os_route_str rbuf;
  int seq;
  os_route os_rt;
  uchar scope;
  nlmsghdr *msg;
  uint8_t buffer [1024];
  _Bool del_similar_local;
  _Bool set_local;
  os_route *route_local;
  
  buffer[0x3fe] = del_similar;
  buffer[0x3ff] = set;
  memset(&msg,0,0x400);
  memcpy(rbuf.buf + 0x15e,route,0xb0);
  msg._6_2_ = 1;
  msg._0_4_ = 0x1c;
  os_rt.cb_get._7_1_ = '\0';
  if ((buffer[0x3ff] & 1) == 0) {
    msg._4_2_ = 0x19;
    os_rt.p.src_ip._addr[0xf] = '\0';
    memset(os_rt.p.gw._addr + 10,0,0x12);
    if ((buffer[0x3fe] & 1) != 0) {
      os_rt.p.metric = 0;
      os_rt.cb_get._7_1_ = 0xff;
    }
  }
  else {
    msg._6_2_ = 0x501;
    msg._4_2_ = 0x18;
  }
  local_6bf = true;
  if (&stack0x00000000 != (undefined1 *)0x52c) {
    local_6bf = os_rt.p.gw._addr[8] == '\0';
  }
  if ((local_6bf) && (os_rt.p.key.dst._addr[8] == '\x02')) {
    uVar2 = os_rt.p.key.dst._addr[9];
    uVar3 = netaddr_get_af_maxprefix(2);
    if (uVar2 == uVar3) {
      os_rt.p.key.src._10_8_ = os_rt.p._0_8_;
      os_rt.p.gw._addr[0] = os_rt.p.key.dst._addr[0];
      os_rt.p.gw._addr[1] = os_rt.p.key.dst._addr[1];
      os_rt.p.gw._addr[2] = os_rt.p.key.dst._addr[2];
      os_rt.p.gw._addr[3] = os_rt.p.key.dst._addr[3];
      os_rt.p.gw._addr[4] = os_rt.p.key.dst._addr[4];
      os_rt.p.gw._addr[5] = os_rt.p.key.dst._addr[5];
      os_rt.p.gw._addr[6] = os_rt.p.key.dst._addr[6];
      os_rt.p.gw._addr[7] = os_rt.p.key.dst._addr[7];
      os_rt.p.gw._addr[8] = os_rt.p.key.dst._addr[8];
      os_rt.p.gw._addr[9] = os_rt.p.key.dst._addr[9];
    }
  }
  oVar1 = _oonf_os_routing_subsystem.logging;
  if (((&log_global_mask)[_oonf_os_routing_subsystem.logging] & 1) != 0) {
    pcVar5 = "re";
    if ((buffer[0x3ff] & 1) != 0) {
      pcVar5 = "";
    }
    pcVar6 = os_routing_generic_rt_to_string
                       ((os_route_str *)local_6be,(os_route_parameter *)(rbuf.buf + 0x15e));
    oonf_log(1,oVar1,"src/base/os_linux/os_routing_linux.c",0xfc,0,0,"%sset route: %s",pcVar5,pcVar6
            );
  }
  iVar4 = _routing_set((nlmsghdr *)&msg,(os_route *)(rbuf.buf + 0x15e),os_rt.cb_get._7_1_);
  if (iVar4 == 0) {
    rbuf.buf._346_4_ = os_system_linux_netlink_send(&_rtnetlink_socket,(nlmsghdr *)&msg);
    if (route->cb_finished != (_func_void_os_route_ptr_int *)0x0) {
      (route->_internal).nl_seq = rbuf.buf._346_4_;
      (route->_internal)._node.key = &(route->_internal).nl_seq;
      oVar1 = _oonf_os_routing_subsystem.logging;
      bVar7 = false;
      if ((route->_internal)._node.list.next != (list_entity *)0x0) {
        bVar7 = (route->_internal)._node.list.prev != (list_entity *)0x0;
      }
      if ((bVar7) && (((&log_global_mask)[_oonf_os_routing_subsystem.logging] & 8) != 0)) {
        pcVar5 = os_routing_generic_rt_to_string
                           ((os_route_str *)local_6be,(os_route_parameter *)(rbuf.buf + 0x15e));
        oonf_log(8,oVar1,"src/base/os_linux/os_routing_linux.c",0x10b,0,0,
                 "route %s is already in feedback list!",pcVar5);
        abort();
      }
      avl_insert(&_rtnetlink_feedback,&route->_internal);
    }
    route_local._4_4_ = 0;
  }
  else {
    route_local._4_4_ = -1;
  }
  return route_local._4_4_;
}

Assistant:

int
os_routing_linux_set(struct os_route *route, bool set, bool del_similar) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  unsigned char scope;
  struct os_route os_rt;
  int seq;
  struct os_route_str rbuf;

  memset(buffer, 0, sizeof(buffer));

  /* copy route settings */
  memcpy(&os_rt, route, sizeof(os_rt));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];

  msg->nlmsg_flags = NLM_F_REQUEST;

  /* set length of netlink message with rtmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(struct rtmsg));

  /* normally all routing operations are UNIVERSE scope */
  scope = RT_SCOPE_UNIVERSE;

  if (set) {
    msg->nlmsg_flags |= NLM_F_CREATE | NLM_F_REPLACE;
    msg->nlmsg_type = RTM_NEWROUTE;
  }
  else {
    msg->nlmsg_type = RTM_DELROUTE;

    os_rt.p.protocol = 0;
    netaddr_invalidate(&os_rt.p.src_ip);

    if (del_similar) {
      /* no interface necessary */
      os_rt.p.if_index = 0;

      /* as wildcard for fuzzy deletion */
      scope = RT_SCOPE_NOWHERE;
    }
  }

  if (netaddr_is_unspec(&os_rt.p.gw) && netaddr_get_address_family(&os_rt.p.key.dst) == AF_INET &&
      netaddr_get_prefix_length(&os_rt.p.key.dst) == netaddr_get_maxprefix(&os_rt.p.key.dst)) {
    /* use destination as gateway, to 'force' linux kernel to do proper source address selection */
    memcpy(&os_rt.p.gw, &os_rt.p.key.dst, sizeof(os_rt.p.gw));
  }

  OONF_DEBUG(LOG_OS_ROUTING, "%sset route: %s", set ? "" : "re", os_routing_to_string(&rbuf, &os_rt.p));

  if (_routing_set(msg, &os_rt, scope)) {
    return -1;
  }

  /* cannot fail */
  seq = os_system_linux_netlink_send(&_rtnetlink_socket, msg);

  if (route->cb_finished) {
    route->_internal.nl_seq = seq;
    route->_internal._node.key = &route->_internal.nl_seq;

    OONF_ASSERT(!avl_is_node_added(&route->_internal._node),
                LOG_OS_ROUTING, "route %s is already in feedback list!",
                os_routing_to_string(&rbuf, &os_rt.p));
    avl_insert(&_rtnetlink_feedback, &route->_internal._node);
  }
  return 0;
}